

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void * sexp_alloc(sexp_conflict ctx,size_t size)

{
  sexp_heap_conflict psVar1;
  sexp_heap_conflict psVar2;
  ulong in_RAX;
  sexp psVar3;
  sexp_conflict psVar4;
  long lVar5;
  size_t total_size;
  ulong uVar6;
  sexp_heap_conflict *ppsVar7;
  ulong size_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t sum_freed;
  ulong local_28;
  
  psVar1 = (ctx->value).context.heap;
  size_00 = size + 0x1f & 0xffffffffffffffe0;
  local_28 = in_RAX;
  psVar3 = (sexp)sexp_try_alloc(ctx,size_00);
  if (psVar3 == (sexp)0x0) {
    psVar4 = sexp_gc(ctx,&local_28);
    uVar6 = 0;
    ppsVar7 = &(ctx->value).context.heap;
    while (psVar2 = *ppsVar7, psVar2 != (sexp_heap_conflict)0x0) {
      uVar6 = uVar6 + psVar2->size;
      ppsVar7 = &psVar2->next;
    }
    if ((((ulong)((long)psVar4 >> 1) < size_00) ||
        ((lVar5 = uVar6 - local_28, local_28 <= uVar6 && lVar5 != 0 &&
         (auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20), auVar8._0_8_ = lVar5,
         auVar8._12_4_ = 0x45300000, auVar9._8_4_ = (int)(uVar6 >> 0x20), auVar9._0_8_ = uVar6,
         auVar9._12_4_ = 0x45300000,
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 0.75 <
         (auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))))) &&
       (uVar6 <= psVar1->max_size - 1)) {
      sexp_grow_heap(ctx,size_00,0);
    }
    psVar3 = (sexp)sexp_try_alloc(ctx,size_00);
    if (psVar3 == (sexp)0x0) {
      psVar3 = (((ctx->value).type.setters)->value).type.print;
    }
  }
  return psVar3;
}

Assistant:

void* sexp_alloc (sexp ctx, size_t size) {
  void *res;
  size_t max_freed, sum_freed, total_size=0;
  sexp_heap h = sexp_context_heap(ctx);
#if SEXP_USE_TRACK_ALLOC_SIZES
  size_t size_bucket;
#endif
#if SEXP_USE_TRACK_ALLOC_TIMES
  sexp_uint_t alloc_time;
  struct timeval start, end;
  gettimeofday(&start, NULL);
#endif
  size = sexp_heap_align(size) + SEXP_GC_PAD;
#if SEXP_USE_TRACK_ALLOC_SIZES
  size_bucket = (size - SEXP_GC_PAD) / sexp_heap_align(1) - 1;
  ++sexp_context_alloc_histogram(ctx)[size_bucket >= SEXP_ALLOC_HISTOGRAM_BUCKETS ? SEXP_ALLOC_HISTOGRAM_BUCKETS-1 : size_bucket];
#endif
  res = sexp_try_alloc(ctx, size);
  if (! res) {
    max_freed = sexp_unbox_fixnum(sexp_gc(ctx, &sum_freed));
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
    sexp_find_fixed_chunk_heap_usage(ctx, size, &sum_freed, &total_size);
#else
    total_size = sexp_heap_total_size(sexp_context_heap(ctx));
#endif
    if (((max_freed < size)
         || ((total_size > sum_freed)
             && (total_size - sum_freed) > (total_size*SEXP_GROW_HEAP_RATIO)))
        && ((!h->max_size) || (total_size < h->max_size)))
      sexp_grow_heap(ctx, size, 0);
    res = sexp_try_alloc(ctx, size);
    if (! res) {
      res = sexp_global(ctx, SEXP_G_OOM_ERROR);
      sexp_debug_printf("ran out of memory allocating %lu bytes => %p", size, res);
    }
  }
#if SEXP_USE_TRACK_ALLOC_TIMES
  gettimeofday(&end, NULL);
  alloc_time = 1000000*(end.tv_sec - start.tv_sec) + (end.tv_usec - start.tv_usec);
  sexp_context_alloc_count(ctx) += 1;
  sexp_context_alloc_usecs(ctx) += alloc_time;
  sexp_context_alloc_usecs_sq(ctx) += alloc_time*alloc_time;
#endif
  return res;
}